

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::PlaTask::checkArguments
          (PlaTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *this_00;
  Type *pTVar3;
  Expression *pEVar4;
  ulong uVar5;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,3,3);
  if (bVar2) {
    for (uVar5 = 0; uVar5 < (args->_M_extent)._M_extent_value; uVar5 = uVar5 + 1) {
      pTVar3 = (args->_M_ptr[uVar5]->type).ptr;
      if (uVar5 == 0) {
        bVar2 = Type::isUnpackedArray(pTVar3);
        if (bVar2) {
          this_00 = Type::getArrayElementType(pTVar3);
          bVar2 = Type::isSimpleBitVector(this_00);
          if ((bVar2) && (bVar2 = Type::isPredefinedInteger(this_00), !bVar2)) {
            bVar2 = Type::hasFixedRange(this_00);
            if ((bVar2) &&
               (((*args->_M_ptr)->kind != Concatenation && (bVar2 = isValidRange(this_00), !bVar2)))
               ) {
              pEVar4 = *args->_M_ptr;
              goto LAB_00429738;
            }
            goto LAB_004296b1;
          }
        }
        pEVar4 = *args->_M_ptr;
LAB_004296f6:
        pTVar3 = SystemSubroutine::badArg((SystemSubroutine *)this,context,pEVar4);
        return pTVar3;
      }
      bVar2 = Type::isSimpleBitVector(pTVar3);
      if ((!bVar2) || (bVar2 = Type::isPredefinedInteger(pTVar3), bVar2)) {
        pEVar4 = args->_M_ptr[uVar5];
        goto LAB_004296f6;
      }
LAB_004296b1:
      bVar2 = Type::hasFixedRange(pTVar3);
      if (((bVar2) && (args->_M_ptr[uVar5]->kind != Concatenation)) &&
         (bVar2 = isValidRange(pTVar3), !bVar2)) {
        pEVar4 = args->_M_ptr[uVar5];
LAB_00429738:
        pTVar3 = badRange(context,pEVar4);
        return pTVar3;
      }
    }
    pTVar3 = pCVar1->voidType;
  }
  else {
    pTVar3 = pCVar1->errorType;
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();

        if (!checkArgCount(context, false, args, range, 3, 3))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            auto& type = *args[i]->type;

            if (i == 0) {
                if (!type.isUnpackedArray()) {
                    return badArg(context, *args[i]);
                }

                auto& elemType = *type.getArrayElementType();
                if (!elemType.isSimpleBitVector() || elemType.isPredefinedInteger()) {
                    return badArg(context, *args[i]);
                }

                if (elemType.hasFixedRange() && args[i]->kind != ExpressionKind::Concatenation &&
                    !isValidRange(elemType)) {
                    return badRange(context, *args[i]);
                }
            }
            else {
                if (!type.isSimpleBitVector() || type.isPredefinedInteger()) {
                    return badArg(context, *args[i]);
                }
            }

            if (type.hasFixedRange() && args[i]->kind != ExpressionKind::Concatenation &&
                !isValidRange(type)) {
                return badRange(context, *args[i]);
            }
        }

        return comp.getVoidType();
    }